

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O1

int gai_iterator_last(_iterator_hdl *hdl)

{
  int iVar1;
  long lVar2;
  Integer IVar3;
  
  lVar2 = hdl->g_a;
  IVar3 = pnga_pgroup_nnodes((long)GA[lVar2 + 1000].p_handle);
  iVar1 = GA[lVar2 + 1000].distr_type;
  if ((iVar1 - 2U < 3) || (iVar1 == 1)) {
    if ((long)(int)IVar3 <= hdl->iproc) {
      return 1;
    }
  }
  else if ((iVar1 == 0) && (hdl->nproc <= hdl->count)) {
    return 1;
  }
  return 0;
}

Assistant:

int gai_iterator_last(_iterator_hdl *hdl)
{
  Integer idx;
  Integer handle = GA_OFFSET + hdl->g_a;
  Integer p_handle = GA[handle].p_handle;
  Integer n_rstrctd = GA[handle].num_rstrctd;
  Integer *rank_rstrctd = GA[handle].rank_rstrctd;
  Integer elemsize = GA[handle].elemsize;
  int ndim;
  int grp = GA[handle].p_handle;
  int nproc = pnga_pgroup_nnodes(grp);
  ndim = GA[handle].ndim;
  if (GA[handle].distr_type == REGULAR) {
    idx = hdl->count;
    /* no blocks left after this iteration */
    if (idx>=hdl->nproc) return 1;
  } else {
    if (GA[handle].distr_type == BLOCK_CYCLIC) {
      /* Simple block-cyclic distribution */
      if (hdl->iproc >= nproc) return 1;
    } else if (GA[handle].distr_type == SCALAPACK ||
        GA[handle].distr_type == TILED ||
        GA[handle].distr_type == TILED_IRREG) {
      if (hdl->iproc >= nproc) return 1;
    }
  }
  return 0;
}